

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O1

float __thiscall
double_conversion::Strtof(double_conversion *this,Vector<const_char> buffer,int exponent)

{
  bool bVar1;
  uint32_t d32;
  int iVar2;
  double dVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  double_conversion **guess;
  ulong uVar7;
  float fVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  DiyFp diy_fp;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  Vector<const_char> trimmed_00;
  int updated_exponent;
  double double_guess;
  Vector<const_char> trimmed;
  char copy_buffer [780];
  int *in_stack_fffffffffffffc98;
  undefined1 local_354 [12];
  double_conversion *local_348;
  uint local_340;
  char local_338 [792];
  
  buffer_00._8_8_ = buffer.start_;
  guess = &local_348;
  local_348 = (double_conversion *)0x0;
  local_340 = 0;
  buffer_00.start_ = (char *)this;
  TrimAndCut(buffer_00,buffer.length_,local_338,(int)guess,(Vector<const_char> *)local_354,
             in_stack_fffffffffffffc98);
  buffer_01.length_ = local_340;
  buffer_01.start_ = (char *)local_348;
  trimmed_00.start_ = (ulong)local_340;
  trimmed_00.length_ = local_354._0_4_;
  trimmed_00._12_4_ = 0;
  bVar1 = ComputeGuess(local_348,trimmed_00,(int)local_354 + 4,(double *)guess);
  if (3.4028234663852886e+38 <= (double)local_354._4_8_) {
    if (3.4028235677973366e+38 <= (double)local_354._4_8_) {
      fVar8 = INFINITY;
    }
    else {
      fVar8 = 3.4028235e+38;
    }
  }
  else {
    fVar8 = (float)(double)local_354._4_8_;
  }
  if (((double)local_354._4_8_ != (double)fVar8) ||
     (NAN((double)local_354._4_8_) || NAN((double)fVar8))) {
    if ((double)local_354._4_8_ == INFINITY) {
      dVar9 = INFINITY;
    }
    else if ((long)local_354._4_8_ < 0) {
      dVar9 = 0.0;
      if (((double)local_354._4_8_ != 0.0) || (NAN((double)local_354._4_8_))) {
        dVar9 = (double)(local_354._4_8_ + -1);
      }
    }
    else {
      dVar9 = (double)(local_354._4_8_ + 1);
    }
    if ((double)local_354._4_8_ == -INFINITY) {
      dVar3 = -INFINITY;
    }
    else if ((long)local_354._4_8_ < 0) {
      dVar3 = (double)(local_354._4_8_ + 1);
    }
    else if ((double)local_354._4_8_ == 0.0) {
      dVar3 = -0.0;
    }
    else {
      dVar3 = (double)(local_354._4_8_ + -1);
    }
    if (3.4028234663852886e+38 <= dVar3) {
      if (3.4028235677973366e+38 <= dVar3) {
        fVar11 = INFINITY;
      }
      else {
        fVar11 = 3.4028235e+38;
      }
    }
    else {
      fVar11 = (float)dVar3;
    }
    if (3.4028234663852886e+38 <= dVar9) {
      if (3.4028235677973366e+38 <= dVar9) {
        fVar10 = INFINITY;
      }
      else {
        fVar10 = 3.4028235e+38;
      }
    }
    else {
      fVar10 = (float)dVar9;
    }
    if (!bVar1) {
      if (dVar9 == INFINITY) {
        dVar3 = INFINITY;
      }
      else if ((long)dVar9 < 0) {
        dVar3 = 0.0;
        if ((dVar9 != 0.0) || (NAN(dVar9))) {
          dVar3 = (double)((long)dVar9 + -1);
        }
      }
      else {
        dVar3 = (double)((long)dVar9 + 1);
      }
      if (3.4028234663852886e+38 <= dVar3) {
        if (3.4028235677973366e+38 <= dVar3) {
          fVar10 = INFINITY;
        }
        else {
          fVar10 = 3.4028235e+38;
        }
      }
      else {
        fVar10 = (float)dVar3;
      }
    }
    if ((fVar11 != fVar10) || (NAN(fVar11) || NAN(fVar10))) {
      if ((fVar11 != 0.0) || (NAN(fVar11))) {
        uVar6 = (int)fVar11 * 2 & 0xfffffe;
        bVar1 = ((uint)fVar11 & 0x7f800000) == 0;
        uVar4 = uVar6 + 0x1000000;
        if (bVar1) {
          uVar4 = uVar6;
        }
        uVar7 = 0xffffff6a;
        if (!bVar1) {
          uVar7 = (ulong)(((uint)fVar11 >> 0x17 & 0xff) - 0x97);
        }
        uVar5 = (ulong)(uVar4 + 1);
      }
      else {
        uVar7 = 0xffffff36;
        uVar5 = 0x10000000000000;
      }
      diy_fp._8_8_ = uVar7;
      diy_fp.f_ = uVar5;
      buffer_01._12_4_ = 0;
      iVar2 = CompareBufferWithDiyFp(buffer_01,local_354._0_4_,diy_fp);
      fVar8 = fVar11;
      if (((-1 < iVar2) && (fVar8 = fVar10, iVar2 == 0)) &&
         (fVar8 = fVar11, ((uint)fVar11 & 1) != 0)) {
        fVar8 = fVar10;
      }
    }
  }
  return fVar8;
}

Assistant:

float Strtof(Vector<const char> buffer, int exponent) {
  char copy_buffer[kMaxSignificantDecimalDigits];
  Vector<const char> trimmed;
  int updated_exponent;
  TrimAndCut(buffer, exponent, copy_buffer, kMaxSignificantDecimalDigits,
             &trimmed, &updated_exponent);
  exponent = updated_exponent;

  double double_guess;
  bool is_correct = ComputeGuess(trimmed, exponent, &double_guess);

  float float_guess = SanitizedDoubletof(double_guess);
  if (float_guess == double_guess) {
    // This shortcut triggers for integer values.
    return float_guess;
  }

  // We must catch double-rounding. Say the double has been rounded up, and is
  // now a boundary of a float, and rounds up again. This is why we have to
  // look at previous too.
  // Example (in decimal numbers):
  //    input: 12349
  //    high-precision (4 digits): 1235
  //    low-precision (3 digits):
  //       when read from input: 123
  //       when rounded from high precision: 124.
  // To do this we simply look at the neigbors of the correct result and see
  // if they would round to the same float. If the guess is not correct we have
  // to look at four values (since two different doubles could be the correct
  // double).

  double double_next = Double(double_guess).NextDouble();
  double double_previous = Double(double_guess).PreviousDouble();

  float f1 = SanitizedDoubletof(double_previous);
  float f2 = float_guess;
  float f3 = SanitizedDoubletof(double_next);
  float f4;
  if (is_correct) {
    f4 = f3;
  } else {
    double double_next2 = Double(double_next).NextDouble();
    f4 = SanitizedDoubletof(double_next2);
  }
  (void) f2;  // Mark variable as used.
  DOUBLE_CONVERSION_ASSERT(f1 <= f2 && f2 <= f3 && f3 <= f4);

  // If the guess doesn't lie near a single-precision boundary we can simply
  // return its float-value.
  if (f1 == f4) {
    return float_guess;
  }

  DOUBLE_CONVERSION_ASSERT((f1 != f2 && f2 == f3 && f3 == f4) ||
         (f1 == f2 && f2 != f3 && f3 == f4) ||
         (f1 == f2 && f2 == f3 && f3 != f4));

  // guess and next are the two possible candidates (in the same way that
  // double_guess was the lower candidate for a double-precision guess).
  float guess = f1;
  float next = f4;
  DiyFp upper_boundary;
  if (guess == 0.0f) {
    float min_float = 1e-45f;
    upper_boundary = Double(static_cast<double>(min_float) / 2).AsDiyFp();
  } else {
    upper_boundary = Single(guess).UpperBoundary();
  }
  int comparison = CompareBufferWithDiyFp(trimmed, exponent, upper_boundary);
  if (comparison < 0) {
    return guess;
  } else if (comparison > 0) {
    return next;
  } else if ((Single(guess).Significand() & 1) == 0) {
    // Round towards even.
    return guess;
  } else {
    return next;
  }
}